

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

void __thiscall BlockCondition::scopeBreak(BlockCondition *this,int4 curexit,int4 curloopexit)

{
  FlowBlock *pFVar1;
  
  pFVar1 = *(this->super_BlockGraph).list.
            super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  (*pFVar1->_vptr_FlowBlock[8])(pFVar1,0xffffffff);
  pFVar1 = (this->super_BlockGraph).list.
           super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
           super__Vector_impl_data._M_start[1];
  (*pFVar1->_vptr_FlowBlock[8])(pFVar1,0xffffffff,(ulong)(uint)curloopexit);
  return;
}

Assistant:

void BlockCondition::scopeBreak(int4 curexit,int4 curloopexit)

{
  getBlock(0)->scopeBreak(-1,curloopexit); // No fixed exit
  getBlock(1)->scopeBreak(-1,curloopexit);
}